

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRPathCheckCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  char *local_1f0;
  string file;
  string local_1c8;
  ostringstream e;
  
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  local_1f0 = (char *)0x0;
  iVar6 = 0;
  uVar5 = 1;
  while( true ) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5)
    break;
    bVar2 = std::operator==(pbVar1 + uVar5,"RPATH");
    if (bVar2) {
      iVar6 = 2;
    }
    else {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar5,"FILE");
      if (bVar2) {
        iVar6 = 1;
      }
      else if (iVar6 == 2) {
        local_1f0 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
        iVar6 = 0;
      }
      else {
        if (iVar6 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar3 = std::operator<<((ostream *)&e,"RPATH_CHECK given unknown argument ");
          std::operator<<(poVar3,(string *)
                                 ((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar5));
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          goto LAB_0017de2a;
        }
        iVar6 = 0;
        std::__cxx11::string::_M_assign((string *)&file);
      }
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  if (file._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"RPATH_CHECK not given FILE option.",(allocator<char> *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  else {
    if (local_1f0 != (char *)0x0) {
      bVar2 = cmsys::SystemTools::FileExists(&file,true);
      bVar4 = true;
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,local_1f0,(allocator<char> *)&local_1c8);
        bVar2 = cmSystemTools::CheckRPath(&file,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        if (!bVar2) {
          cmsys::SystemTools::RemoveFile(&file);
        }
      }
      goto LAB_0017de2c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"RPATH_CHECK not given RPATH option.",(allocator<char> *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  std::__cxx11::string::~string((string *)&e);
LAB_0017de2a:
  bVar4 = false;
LAB_0017de2c:
  std::__cxx11::string::~string((string *)&file);
  return bVar4;
}

Assistant:

bool cmFileCommand::HandleRPathCheckCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  const char* rpath = nullptr;
  enum Doing
  {
    DoingNone,
    DoingFile,
    DoingRPath
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "RPATH") {
      doing = DoingRPath;
    } else if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else if (doing == DoingRPath) {
      rpath = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_CHECK given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_CHECK not given FILE option.");
    return false;
  }
  if (!rpath) {
    this->SetError("RPATH_CHECK not given RPATH option.");
    return false;
  }

  // If the file exists but does not have the desired RPath then
  // delete it.  This is used during installation to re-install a file
  // if its RPath will change.
  if (cmSystemTools::FileExists(file, true) &&
      !cmSystemTools::CheckRPath(file, rpath)) {
    cmSystemTools::RemoveFile(file);
  }

  return true;
}